

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall cmCTestTestHandler::UpdateForFixtures(cmCTestTestHandler *this,ListOfTests *tests)

{
  char **ppcVar1;
  char **ppcVar2;
  cmCTest *pcVar3;
  pointer pcVar4;
  iterator iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  value_type *pvVar6;
  _Base_ptr p_Var7;
  unsigned_long uVar8;
  bool bVar9;
  long *plVar10;
  _Rb_tree_node_base *p_Var11;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>
  _Var14;
  ostream *poVar15;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>
  _Var16;
  _Base_ptr p_Var17;
  iterator iVar18;
  long *plVar19;
  size_type *psVar20;
  cmCTestTestProperties *p;
  pointer pcVar21;
  pointer pcVar22;
  iterator __begin1;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  *pvVar23;
  cmCTestTestHandler *pcVar24;
  _Base_ptr p_Var25;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>
  sIt;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  pVar26;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar27;
  ListOfTests *__range1;
  string cleanupRegExp;
  string setupRegExp;
  FixtureDependencies fixtureSetups;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fixtures;
  ostringstream cmCTestLog_msg;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  setupFixturesAdded;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  fixtureRequirements;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedTests;
  RegularExpression excludeSetupRegex;
  FixtureDependencies fixtureCleanups;
  RegularExpression excludeCleanupRegex;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedFixtures;
  unsigned_long local_530;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  *local_528;
  cmCTestTestHandler *local_520;
  _Base_ptr local_518;
  _Rb_tree_node_base *local_510;
  long local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  long *local_4e0;
  long local_4d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [32];
  _Base_ptr local_480;
  size_t local_478;
  pointer local_470;
  char *local_468;
  _Rb_tree_node_base local_460;
  undefined1 local_438 [32];
  __normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
  local_418;
  ios_base local_3c8 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_2c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_290;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  RegularExpression local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  local_160;
  RegularExpression local_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_438,"Updating test list for fixtures",0x1f);
  std::ios::widen((char)(ostringstream *)local_438 + (char)*(undefined8 *)(local_438._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_438);
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x3d3,local_230.regmatch.startp[0],(this->super_cmCTestGenericHandler).Quiet);
  ppcVar1 = local_230.regmatch.startp + 2;
  if ((char **)local_230.regmatch.startp[0] != ppcVar1) {
    operator_delete(local_230.regmatch.startp[0],(ulong)(local_230.regmatch.startp[2] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  pcVar4 = (this->ExcludeFixtureRegExp)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c0,pcVar4,pcVar4 + (this->ExcludeFixtureRegExp)._M_string_length);
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  pcVar4 = (this->ExcludeFixtureRegExp)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_500,pcVar4,pcVar4 + (this->ExcludeFixtureRegExp)._M_string_length);
  local_520 = this;
  if ((this->ExcludeFixtureSetupRegExp)._M_string_length != 0) {
    if (local_4c0._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_4c0);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                     "(",&local_4c0);
      plVar10 = (long *)std::__cxx11::string::append(local_4a0);
      ppcVar2 = local_130.regmatch.startp + 2;
      plVar19 = plVar10 + 2;
      if ((char **)*plVar10 == (char **)plVar19) {
        local_130.regmatch.startp[2] = (char *)*plVar19;
        local_130.regmatch.startp[3] = (char *)plVar10[3];
        local_130.regmatch.startp[0] = (char *)ppcVar2;
      }
      else {
        local_130.regmatch.startp[2] = (char *)*plVar19;
        local_130.regmatch.startp[0] = (char *)*plVar10;
      }
      local_130.regmatch.startp[1] = (char *)plVar10[1];
      *plVar10 = (long)plVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_130,
                                   (ulong)(this->ExcludeFixtureSetupRegExp)._M_dataplus._M_p);
      plVar19 = plVar10 + 2;
      if ((char **)*plVar10 == (char **)plVar19) {
        local_230.regmatch.startp[2] = (char *)*plVar19;
        local_230.regmatch.startp[3] = (char *)plVar10[3];
        local_230.regmatch.startp[0] = (char *)ppcVar1;
      }
      else {
        local_230.regmatch.startp[2] = (char *)*plVar19;
        local_230.regmatch.startp[0] = (char *)*plVar10;
      }
      local_230.regmatch.startp[1] = (char *)plVar10[1];
      *plVar10 = (long)plVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_230);
      psVar20 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar20) {
        local_438._16_8_ = *psVar20;
        local_438._24_8_ = plVar10[3];
        local_438._0_8_ = local_438 + 0x10;
      }
      else {
        local_438._16_8_ = *psVar20;
        local_438._0_8_ = (size_type *)*plVar10;
      }
      local_438._8_8_ = plVar10[1];
      *plVar10 = (long)psVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_4c0,local_438._0_8_);
      if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      this = local_520;
      if ((char **)local_230.regmatch.startp[0] != ppcVar1) {
        operator_delete(local_230.regmatch.startp[0],(ulong)(local_230.regmatch.startp[2] + 1));
      }
      if ((char **)local_130.regmatch.startp[0] != ppcVar2) {
        operator_delete(local_130.regmatch.startp[0],(ulong)(local_130.regmatch.startp[2] + 1));
      }
      if ((undefined1 *)local_4a0._0_8_ != local_4a0 + 0x10) {
        operator_delete((void *)local_4a0._0_8_,local_4a0._16_8_ + 1);
      }
    }
  }
  if ((this->ExcludeFixtureCleanupRegExp)._M_string_length != 0) {
    if (local_500._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_500);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                     "(",&local_500);
      plVar10 = (long *)std::__cxx11::string::append(local_4a0);
      ppcVar2 = local_130.regmatch.startp + 2;
      plVar19 = plVar10 + 2;
      if ((char **)*plVar10 == (char **)plVar19) {
        local_130.regmatch.startp[2] = (char *)*plVar19;
        local_130.regmatch.startp[3] = (char *)plVar10[3];
        local_130.regmatch.startp[0] = (char *)ppcVar2;
      }
      else {
        local_130.regmatch.startp[2] = (char *)*plVar19;
        local_130.regmatch.startp[0] = (char *)*plVar10;
      }
      local_130.regmatch.startp[1] = (char *)plVar10[1];
      *plVar10 = (long)plVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_130,
                                   (ulong)(this->ExcludeFixtureCleanupRegExp)._M_dataplus._M_p);
      plVar19 = plVar10 + 2;
      if ((char **)*plVar10 == (char **)plVar19) {
        local_230.regmatch.startp[2] = (char *)*plVar19;
        local_230.regmatch.startp[3] = (char *)plVar10[3];
        local_230.regmatch.startp[0] = (char *)ppcVar1;
      }
      else {
        local_230.regmatch.startp[2] = (char *)*plVar19;
        local_230.regmatch.startp[0] = (char *)*plVar10;
      }
      local_230.regmatch.startp[1] = (char *)plVar10[1];
      *plVar10 = (long)plVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_230);
      psVar20 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar20) {
        local_438._16_8_ = *psVar20;
        local_438._24_8_ = plVar10[3];
        local_438._0_8_ = local_438 + 0x10;
      }
      else {
        local_438._16_8_ = *psVar20;
        local_438._0_8_ = (size_type *)*plVar10;
      }
      local_438._8_8_ = plVar10[1];
      *plVar10 = (long)psVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_500,local_438._0_8_);
      if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      if ((char **)local_230.regmatch.startp[0] != ppcVar1) {
        operator_delete(local_230.regmatch.startp[0],(ulong)(local_230.regmatch.startp[2] + 1));
      }
      if ((char **)local_130.regmatch.startp[0] != ppcVar2) {
        operator_delete(local_130.regmatch.startp[0],(ulong)(local_130.regmatch.startp[2] + 1));
      }
      if ((undefined1 *)local_4a0._0_8_ != local_4a0 + 0x10) {
        operator_delete((void *)local_4a0._0_8_,local_4a0._16_8_ + 1);
      }
    }
  }
  local_230.regmust = (char *)0x0;
  local_230.program = (char *)0x0;
  local_230.progsize = 0;
  local_528 = tests;
  memset(&local_230,0,0xaa);
  cmsys::RegularExpression::compile(&local_230,local_4c0._M_dataplus._M_p);
  local_130.regmust = (char *)0x0;
  local_130.program = (char *)0x0;
  local_130.progsize = 0;
  memset(&local_130,0,0xaa);
  cmsys::RegularExpression::compile(&local_130,local_500._M_dataplus._M_p);
  pcVar24 = local_520;
  local_4a0._24_8_ = local_4a0 + 8;
  local_4a0._8_4_ = _S_red;
  local_4a0._16_8_ = 0;
  local_478 = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_160._M_impl.super__Rb_tree_header._M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar21 = (local_520->TestList).
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_480 = (_Base_ptr)local_4a0._24_8_;
  local_160._M_impl.super__Rb_tree_header._M_header._M_right =
       local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar21 !=
      (local_520->TestList).
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar4 = local_438 + 0x10;
    do {
      for (p_Var11 = (pcVar21->FixturesSetup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != &(pcVar21->FixturesSetup)._M_t._M_impl.super__Rb_tree_header
          ; p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        local_438._0_8_ = pcVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        local_418._M_current = pcVar21;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
        ::
        _M_emplace_equal<std::pair<std::__cxx11::string,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
                    *)local_4a0,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>
                    *)local_438);
        if ((pointer)local_438._0_8_ != pcVar4) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
      }
      for (p_Var11 = (pcVar21->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var11 !=
            &(pcVar21->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        local_438._0_8_ = pcVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        local_418._M_current = pcVar21;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
        ::
        _M_emplace_equal<std::pair<std::__cxx11::string,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
                    *)&local_160,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>
                    *)local_438);
        if ((pointer)local_438._0_8_ != pcVar4) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
      }
      pcVar21 = pcVar21 + 1;
    } while (pcVar21 !=
             (pcVar24->TestList).
             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pvVar23 = local_528;
  local_260._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_260._M_impl.super__Rb_tree_header._M_header;
  local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar21 = (local_528->
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar22 = (local_528->
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_260._M_impl.super__Rb_tree_header._M_header._M_right =
       local_260._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar21 != pcVar22) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_260,&pcVar21->Name);
      pcVar21 = pcVar21 + 1;
    } while (pcVar21 != pcVar22);
  }
  local_290._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_290._M_impl.super__Rb_tree_header._M_header;
  local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c0._M_impl.super__Rb_tree_header._M_header;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_530 = 0;
  pcVar21 = (pvVar23->
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar22 = (pvVar23->
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pcVar24 = local_520;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_290._M_impl.super__Rb_tree_header._M_header._M_right =
       local_290._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar22 == pcVar21) {
    local_508 = 0;
  }
  else {
    local_508 = 0;
    do {
      if (pcVar21[local_530].Disabled == false) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_468,&pcVar21[local_530].FixturesRequired._M_t);
        for (p_Var11 = local_460._M_left; p_Var11 != &local_460;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          if (p_Var11[1]._M_parent != (_Base_ptr)0x0) {
            p_Var17 = p_Var11 + 1;
            pvVar12 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                    *)&local_290,(key_type *)p_Var17);
            iVar5._M_current = *(unsigned_long **)(pvVar12 + 8);
            if (iVar5._M_current == *(unsigned_long **)(pvVar12 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar12,iVar5,&local_530);
            }
            else {
              *iVar5._M_current = local_530;
              *(unsigned_long **)(pvVar12 + 8) = iVar5._M_current + 1;
            }
            local_518 = p_Var17;
            pVar26 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                     ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                                    *)local_4a0,(key_type *)p_Var17);
            _Var14 = pVar26.first._M_node;
            p_Var17 = local_518;
            while (local_518 = p_Var17, _Var14._M_node != pVar26.second._M_node._M_node) {
              __v = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     (_Var14._M_node + 2);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(pvVar23->
                             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                             )._M_impl.super__Vector_impl_data._M_start[local_530].
                             RequireSuccessDepends,__v);
              uVar8 = local_530;
              pcVar21 = (local_528->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              _Var13 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (pcVar21[local_530].Depends.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  *(pointer *)
                                   ((long)&pcVar21[local_530].Depends.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl + 8),__v);
              if (_Var13._M_current ==
                  *(pointer *)
                   ((long)&pcVar21[uVar8].Depends.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + 8)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&(local_528->
                             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                             )._M_impl.super__Vector_impl_data._M_start[local_530].Depends,__v);
              }
              _Var14._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var14._M_node);
              pvVar23 = local_528;
              p_Var17 = local_518;
            }
            pVar27 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&local_60,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var17);
            pcVar24 = local_520;
            if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_510 = p_Var11;
              if (((local_4c0._M_string_length == 0) ||
                  (bVar9 = cmsys::RegularExpression::find
                                     (&local_230,*(char **)p_Var17,&local_230.regmatch), !bVar9)) &&
                 (pVar26 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                           ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                                          *)local_4a0,(key_type *)p_Var17),
                 pVar26.first._M_node._M_node != pVar26.second._M_node._M_node)) {
                do {
                  _Var14 = pVar26.second._M_node;
                  pvVar6 = *(value_type **)(pVar26.first._M_node._M_node + 2);
                  pVar27 = std::
                           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           ::_M_insert_unique<std::__cxx11::string_const&>
                                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                       *)&local_260,&pvVar6->Name);
                  if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    std::
                    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    ::push_back(pvVar23,pvVar6);
                    (pvVar23->
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1].Index =
                         (int)((ulong)((long)pvVar6 -
                                      (long)(pcVar24->TestList).
                                            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 8) *
                         -0x55555555 + 1;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_438,"Added setup test ",0x11);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_438,(pvVar6->Name)._M_dataplus._M_p,
                                         (pvVar6->Name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," required by fixture ",0x15);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15,*(char **)(local_510 + 1),
                                         (long)local_510[1]._M_parent);
                    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
                    std::ostream::put((char)poVar15);
                    std::ostream::flush();
                    pcVar3 = (pcVar24->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar3,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                 ,0x45d,(char *)local_4e0,
                                 (pcVar24->super_cmCTestGenericHandler).Quiet);
                    if (local_4e0 != local_4d0) {
                      operator_delete(local_4e0,local_4d0[0] + 1);
                    }
                    local_508 = local_508 + 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                    std::ios_base::~ios_base(local_3c8);
                  }
                  _Var16._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar26.first._M_node._M_node);
                  pVar26.second._M_node = _Var14._M_node;
                  pVar26.first._M_node = _Var16._M_node;
                } while (_Var16._M_node != _Var14._M_node);
              }
              p_Var11 = local_510;
              p_Var17 = local_518;
              if ((local_500._M_string_length == 0) ||
                 (bVar9 = cmsys::RegularExpression::find
                                    (&local_130,*(char **)local_518,&local_130.regmatch), !bVar9)) {
                pVar26 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                         ::equal_range(&local_160,(key_type *)p_Var17);
                for (_Var14 = pVar26.first._M_node; _Var14._M_node != pVar26.second._M_node._M_node;
                    _Var14._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var14._M_node)) {
                  pvVar6 = *(value_type **)(_Var14._M_node + 2);
                  pVar27 = std::
                           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           ::_M_insert_unique<std::__cxx11::string_const&>
                                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                       *)&local_260,&pvVar6->Name);
                  pvVar23 = local_528;
                  if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    std::
                    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    ::push_back(local_528,pvVar6);
                    (pvVar23->
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1].Index =
                         (int)((ulong)((long)pvVar6 -
                                      (long)(pcVar24->TestList).
                                            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 8) *
                         -0x55555555 + 1;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_438,"Added cleanup test ",0x13);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_438,(pvVar6->Name)._M_dataplus._M_p,
                                         (pvVar6->Name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," required by fixture ",0x15);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent)
                    ;
                    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
                    std::ostream::put((char)poVar15);
                    std::ostream::flush();
                    pcVar3 = (pcVar24->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar3,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                 ,0x47c,(char *)local_4e0,
                                 (pcVar24->super_cmCTestGenericHandler).Quiet);
                    if (local_4e0 != local_4d0) {
                      operator_delete(local_4e0,local_4d0[0] + 1);
                    }
                    local_508 = local_508 + 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                    std::ios_base::~ios_base(local_3c8);
                  }
                  pvVar23 = local_528;
                }
              }
            }
          }
        }
        pcVar21 = (pvVar23->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pcVar22 = pcVar21 + local_530;
        for (p_Var17 = *(_Base_ptr *)((long)&pcVar21[local_530].FixturesSetup._M_t._M_impl + 0x18);
            p_Var17 != (_Rb_tree_node_base *)((long)&(pcVar22->FixturesSetup)._M_t._M_impl + 8U);
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
          if (p_Var17[1]._M_parent != (_Base_ptr)0x0) {
            pvVar12 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                    *)&local_2c0,(key_type *)(p_Var17 + 1));
            iVar5._M_current = *(unsigned_long **)(pvVar12 + 8);
            if (iVar5._M_current == *(unsigned_long **)(pvVar12 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar12,iVar5,&local_530);
            }
            else {
              *iVar5._M_current = local_530;
              *(unsigned_long **)(pvVar12 + 8) = iVar5._M_current + 1;
            }
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_468);
      }
      local_530 = local_530 + 1;
      pcVar21 = (pvVar23->
                super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar22 = (pvVar23->
                super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (local_530 < (ulong)(((long)pcVar22 - (long)pcVar21 >> 8) * -0x5555555555555555));
  }
  if (pcVar21 != pcVar22) {
    do {
      local_470 = pcVar22;
      p_Var17 = (pcVar21->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_518 = &(pcVar21->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var17 != local_518) {
        do {
          iVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::find(&local_290,(key_type *)(p_Var17 + 1));
          local_510 = p_Var17;
          if ((_Rb_tree_header *)iVar18._M_node != &local_290._M_impl.super__Rb_tree_header) {
            p_Var7 = iVar18._M_node[2]._M_parent;
            for (p_Var25 = *(_Base_ptr *)(iVar18._M_node + 2); p_Var25 != p_Var7;
                p_Var25 = (_Base_ptr)&p_Var25->_M_parent) {
              pcVar22 = (local_528->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var25;
              _Var13 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 ((pcVar21->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pcVar21->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,pcVar22);
              if (_Var13._M_current ==
                  (pcVar21->Depends).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar21->Depends,&pcVar22->Name);
              }
            }
          }
          iVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::find(&local_2c0,(key_type *)(p_Var17 + 1));
          pvVar23 = local_528;
          if ((_Rb_tree_header *)iVar18._M_node != &local_2c0._M_impl.super__Rb_tree_header) {
            p_Var25 = iVar18._M_node[2]._M_parent;
            for (p_Var17 = *(_Base_ptr *)(iVar18._M_node + 2); p_Var17 != p_Var25;
                p_Var17 = (_Base_ptr)&p_Var17->_M_parent) {
              pcVar22 = (pvVar23->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var17;
              _Var13 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 ((pcVar21->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pcVar21->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,pcVar22);
              if (_Var13._M_current ==
                  (pcVar21->Depends).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar21->Depends,&pcVar22->Name);
              }
            }
          }
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(local_510);
          pcVar24 = local_520;
        } while (p_Var17 != local_518);
      }
      pcVar21 = pcVar21 + 1;
      pcVar22 = local_470;
    } while (pcVar21 != local_470);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Added ",6);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_438);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar15," tests to meet fixture requirements",0x23);
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  pcVar3 = (pcVar24->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x4b4,local_468,(pcVar24->super_cmCTestGenericHandler).Quiet);
  if ((_Base_ptr *)local_468 != &local_460._M_parent) {
    operator_delete(local_468,(ulong)((long)&(local_460._M_parent)->_M_color + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&local_2c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&local_290);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_260);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  ::~_Rb_tree(&local_160);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
               *)local_4a0);
  if (local_130.program != (char *)0x0) {
    operator_delete__(local_130.program);
  }
  if (local_230.program != (char *)0x0) {
    operator_delete__(local_230.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestTestHandler::UpdateForFixtures(ListOfTests& tests) const
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Updating test list for fixtures" << std::endl,
                     this->Quiet);

  // Prepare regular expression evaluators
  std::string setupRegExp(this->ExcludeFixtureRegExp);
  std::string cleanupRegExp(this->ExcludeFixtureRegExp);
  if (!this->ExcludeFixtureSetupRegExp.empty()) {
    if (setupRegExp.empty()) {
      setupRegExp = this->ExcludeFixtureSetupRegExp;
    } else {
      setupRegExp.append("(" + setupRegExp + ")|(" +
                         this->ExcludeFixtureSetupRegExp + ")");
    }
  }
  if (!this->ExcludeFixtureCleanupRegExp.empty()) {
    if (cleanupRegExp.empty()) {
      cleanupRegExp = this->ExcludeFixtureCleanupRegExp;
    } else {
      cleanupRegExp.append("(" + cleanupRegExp + ")|(" +
                           this->ExcludeFixtureCleanupRegExp + ")");
    }
  }
  cmsys::RegularExpression excludeSetupRegex(setupRegExp);
  cmsys::RegularExpression excludeCleanupRegex(cleanupRegExp);

  // Prepare some maps to help us find setup and cleanup tests for
  // any given fixture
  using TestIterator = ListOfTests::const_iterator;
  using FixtureDependencies = std::multimap<std::string, TestIterator>;
  using FixtureDepsIterator = FixtureDependencies::const_iterator;
  FixtureDependencies fixtureSetups;
  FixtureDependencies fixtureCleanups;

  for (auto it = this->TestList.begin(); it != this->TestList.end(); ++it) {
    const cmCTestTestProperties& p = *it;

    for (std::string const& deps : p.FixturesSetup) {
      fixtureSetups.insert(std::make_pair(deps, it));
    }

    for (std::string const& deps : p.FixturesCleanup) {
      fixtureCleanups.insert(std::make_pair(deps, it));
    }
  }

  // Prepare fast lookup of tests already included in our list of tests
  std::set<std::string> addedTests;
  for (cmCTestTestProperties const& p : tests) {
    addedTests.insert(p.Name);
  }

  // These are lookups of fixture name to a list of indices into the final
  // tests array for tests which require that fixture and tests which are
  // setups for that fixture. They are needed at the end to populate
  // dependencies of the cleanup tests in our final list of tests.
  std::map<std::string, std::vector<size_t>> fixtureRequirements;
  std::map<std::string, std::vector<size_t>> setupFixturesAdded;

  // Use integer index for iteration because we append to
  // the tests vector as we go
  size_t fixtureTestsAdded = 0;
  std::set<std::string> addedFixtures;
  for (size_t i = 0; i < tests.size(); ++i) {
    // Skip disabled tests
    if (tests[i].Disabled) {
      continue;
    }

    // There are two things to do for each test:
    //   1. For every fixture required by this test, record that fixture as
    //      being required and create dependencies on that fixture's setup
    //      tests.
    //   2. Record all setup tests in the final test list so we can later make
    //      cleanup tests in the test list depend on their associated setup
    //      tests to enforce correct ordering.

    // 1. Handle fixture requirements
    //
    // Must copy the set of fixtures required because we may invalidate
    // the tests array by appending to it
    std::set<std::string> fixtures = tests[i].FixturesRequired;
    for (std::string const& requiredFixtureName : fixtures) {
      if (requiredFixtureName.empty()) {
        continue;
      }

      fixtureRequirements[requiredFixtureName].push_back(i);

      // Add dependencies to this test for all of the setup tests
      // associated with the required fixture. If any of those setup
      // tests fail, this test should not run. We make the fixture's
      // cleanup tests depend on this test case later.
      std::pair<FixtureDepsIterator, FixtureDepsIterator> setupRange =
        fixtureSetups.equal_range(requiredFixtureName);
      for (auto sIt = setupRange.first; sIt != setupRange.second; ++sIt) {
        const std::string& setupTestName = sIt->second->Name;
        tests[i].RequireSuccessDepends.insert(setupTestName);
        if (!cm::contains(tests[i].Depends, setupTestName)) {
          tests[i].Depends.push_back(setupTestName);
        }
      }

      // Append any fixture setup/cleanup tests to our test list if they
      // are not already in it (they could have been in the original
      // set of tests passed to us at the outset or have already been
      // added from a previously checked test). A fixture isn't required
      // to have setup/cleanup tests.
      if (!addedFixtures.insert(requiredFixtureName).second) {
        // Already seen this fixture, no need to check it again
        continue;
      }

      // Only add setup tests if this fixture has not been excluded
      if (setupRegExp.empty() ||
          !excludeSetupRegex.find(requiredFixtureName)) {
        std::pair<FixtureDepsIterator, FixtureDepsIterator> fixtureRange =
          fixtureSetups.equal_range(requiredFixtureName);
        for (auto it = fixtureRange.first; it != fixtureRange.second; ++it) {
          ListOfTests::const_iterator lotIt = it->second;
          const cmCTestTestProperties& p = *lotIt;

          if (!addedTests.insert(p.Name).second) {
            // Already have p in our test list
            continue;
          }

          // This is a test not yet in our list, so add it and
          // update its index to reflect where it was in the original
          // full list of all tests (needed to track individual tests
          // across ctest runs for re-run failed, etc.)
          tests.push_back(p);
          tests.back().Index =
            1 + static_cast<int>(std::distance(this->TestList.begin(), lotIt));
          ++fixtureTestsAdded;

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Added setup test "
                               << p.Name << " required by fixture "
                               << requiredFixtureName << std::endl,
                             this->Quiet);
        }
      }

      // Only add cleanup tests if this fixture has not been excluded
      if (cleanupRegExp.empty() ||
          !excludeCleanupRegex.find(requiredFixtureName)) {
        std::pair<FixtureDepsIterator, FixtureDepsIterator> fixtureRange =
          fixtureCleanups.equal_range(requiredFixtureName);
        for (auto it = fixtureRange.first; it != fixtureRange.second; ++it) {
          ListOfTests::const_iterator lotIt = it->second;
          const cmCTestTestProperties& p = *lotIt;

          if (!addedTests.insert(p.Name).second) {
            // Already have p in our test list
            continue;
          }

          // This is a test not yet in our list, so add it and
          // update its index to reflect where it was in the original
          // full list of all tests (needed to track individual tests
          // across ctest runs for re-run failed, etc.)
          tests.push_back(p);
          tests.back().Index =
            1 + static_cast<int>(std::distance(this->TestList.begin(), lotIt));
          ++fixtureTestsAdded;

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Added cleanup test "
                               << p.Name << " required by fixture "
                               << requiredFixtureName << std::endl,
                             this->Quiet);
        }
      }
    }

    // 2. Record all setup fixtures included in the final list of tests
    for (std::string const& setupFixtureName : tests[i].FixturesSetup) {
      if (setupFixtureName.empty()) {
        continue;
      }

      setupFixturesAdded[setupFixtureName].push_back(i);
    }
  }

  // Now that we have the final list of tests, we can update all cleanup
  // tests to depend on those tests which require that fixture and on any
  // setup tests for that fixture. The latter is required to handle the
  // pathological case where setup and cleanup tests are in the test set
  // but no other test has that fixture as a requirement.
  for (cmCTestTestProperties& p : tests) {
    const std::set<std::string>& cleanups = p.FixturesCleanup;
    for (std::string const& fixture : cleanups) {
      // This cleanup test could be part of the original test list that was
      // passed in. It is then possible that no other test requires the
      // fIt fixture, so we have to check for this.
      auto cIt = fixtureRequirements.find(fixture);
      if (cIt != fixtureRequirements.end()) {
        const std::vector<size_t>& indices = cIt->second;
        for (size_t index : indices) {
          const std::string& reqTestName = tests[index].Name;
          if (!cm::contains(p.Depends, reqTestName)) {
            p.Depends.push_back(reqTestName);
          }
        }
      }

      // Ensure fixture cleanup tests always run after their setup tests, even
      // if no other test cases require the fixture
      cIt = setupFixturesAdded.find(fixture);
      if (cIt != setupFixturesAdded.end()) {
        const std::vector<size_t>& indices = cIt->second;
        for (size_t index : indices) {
          const std::string& setupTestName = tests[index].Name;
          if (!cm::contains(p.Depends, setupTestName)) {
            p.Depends.push_back(setupTestName);
          }
        }
      }
    }
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Added " << fixtureTestsAdded
                              << " tests to meet fixture requirements"
                              << std::endl,
                     this->Quiet);
}